

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

Var __thiscall
Js::InterpreterStackFrame::OP_LdHeapArgsCached
          (InterpreterStackFrame *this,ScriptContext *scriptContext)

{
  ushort uVar1;
  JavascriptFunction *funcCallee;
  Var pvVar2;
  
  uVar1 = *(ushort *)(*(long *)(this + 0x88) + 0x50);
  funcCallee = (JavascriptFunction *)(**(code **)(**(long **)(this + 0x80) + 0x3d0))();
  pvVar2 = JavascriptOperators::LoadHeapArgsCached
                     (funcCallee,*(int *)(this + 0x18) - 1,uVar1 - 1,
                      (Var *)(*(long *)(this + 0x20) + 8),*(Var *)(this + 0x58),scriptContext,false)
  ;
  *(Var *)(this + 0x40) = pvVar2;
  return pvVar2;
}

Assistant:

Var InterpreterStackFrame::OP_LdHeapArgsCached(ScriptContext* scriptContext)
    {
        uint32 formalsCount = this->m_functionBody->GetInParamsCount() - 1;
        Var args = JavascriptOperators::LoadHeapArgsCached(this->function->GetRealFunctionObject(), this->m_inSlotsCount - 1, formalsCount, &this->m_inParams[1], this->localClosure, scriptContext, false);
        this->m_arguments = args;
        return args;
    }